

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::DisneyMaterial::writeTo(DisneyMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  BinaryWriter::writeRaw(binary,&this->anisotropic,4);
  BinaryWriter::writeRaw(binary,&this->clearCoat,4);
  BinaryWriter::writeRaw(binary,&this->clearCoatGloss,4);
  BinaryWriter::writeRaw(binary,&this->color,0xc);
  BinaryWriter::writeRaw(binary,&this->diffTrans,4);
  BinaryWriter::writeRaw(binary,&this->eta,4);
  BinaryWriter::writeRaw(binary,&this->flatness,4);
  BinaryWriter::writeRaw(binary,&this->metallic,4);
  BinaryWriter::writeRaw(binary,&this->roughness,4);
  BinaryWriter::writeRaw(binary,&this->sheen,4);
  BinaryWriter::writeRaw(binary,&this->sheenTint,4);
  BinaryWriter::writeRaw(binary,&this->specTrans,4);
  BinaryWriter::writeRaw(binary,&this->specularTint,4);
  BinaryWriter::writeRaw(binary,&this->thin,1);
  return 0xb;
}

Assistant:

int DisneyMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(anisotropic);
    binary.write(clearCoat);
    binary.write(clearCoatGloss);
    binary.write(color);
    binary.write(diffTrans);
    binary.write(eta);
    binary.write(flatness);
    binary.write(metallic);
    binary.write(roughness);
    binary.write(sheen);
    binary.write(sheenTint);
    binary.write(specTrans);
    binary.write(specularTint);
    binary.write(thin);
    return TYPE_DISNEY_MATERIAL;
  }